

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

void __thiscall QDebug::putQtOrdering(QDebug *this,QtOrderingTypeFlag flags,partial_ordering order)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  partial_ordering in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  bool isStrong;
  string result;
  undefined4 in_stack_ffffffffffffff78;
  QtOrderingType in_stack_ffffffffffffff7c;
  QtOrderingType in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  QFlagsStorage<QtOrderingPrivate::QtOrderingType> lhs;
  QFlagsStorage<QtOrderingPrivate::QtOrderingType> in_stack_ffffffffffffff98;
  QFlagsStorage<QtOrderingPrivate::QtOrderingType> in_stack_ffffffffffffff9c;
  char *string;
  
  lhs.i = (Int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  string = &DAT_aaaaaaaaaaaaaaaa;
  std::__cxx11::string::string(in_RDI);
  QFlags<QtOrderingPrivate::QtOrderingType>::operator&
            ((QFlags<QtOrderingPrivate::QtOrderingType> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c
            );
  bVar2 = ::operator==((QFlags<QtOrderingPrivate::QtOrderingType>)lhs.i,in_stack_ffffffffffffff80);
  if (bVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  else {
    QFlags<QtOrderingPrivate::QtOrderingType>::operator&
              ((QFlags<QtOrderingPrivate::QtOrderingType> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
    bVar2 = ::operator==((QFlags<QtOrderingPrivate::QtOrderingType>)lhs.i,in_stack_ffffffffffffff80)
    ;
    if (bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QFlags<QtOrderingPrivate::QtOrderingType>::operator&
            ((QFlags<QtOrderingPrivate::QtOrderingType> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c
            );
  bVar2 = ::operator==((QFlags<QtOrderingPrivate::QtOrderingType>)lhs.i,in_stack_ffffffffffffff80);
  if (bVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  else {
    in_stack_ffffffffffffff9c.i =
         (Int)QFlags<QtOrderingPrivate::QtOrderingType>::operator&
                        ((QFlags<QtOrderingPrivate::QtOrderingType> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff7c);
    bVar3 = ::operator==((QFlags<QtOrderingPrivate::QtOrderingType>)lhs.i,in_stack_ffffffffffffff80)
    ;
    if (bVar3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    else {
      in_stack_ffffffffffffff98.i =
           (Int)QFlags<QtOrderingPrivate::QtOrderingType>::operator&
                          ((QFlags<QtOrderingPrivate::QtOrderingType> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff7c);
      bVar3 = ::operator==((QFlags<QtOrderingPrivate::QtOrderingType>)lhs.i,
                           in_stack_ffffffffffffff80);
      if (bVar3) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bVar3 = Qt::operator==(in_DL,(partial_ordering)0x0);
  if (bVar3) {
    if (bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
  }
  else {
    bVar2 = Qt::operator==(in_DL,(partial_ordering)0x1);
    if (bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    else {
      bVar2 = Qt::operator==(in_DL,(partial_ordering)0xff);
      if (bVar2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27926e);
  QTextStream::operator<<
            ((QTextStream *)CONCAT44(in_stack_ffffffffffffff9c.i,in_stack_ffffffffffffff98.i),string
            );
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDebug::putQtOrdering(QtOrderingPrivate::QtOrderingTypeFlag flags, Qt::partial_ordering order)
{
    using QtOrderingPrivate::QtOrderingType;
    std::string result;
    if ((flags & QtOrderingType::StdOrder) == QtOrderingType::StdOrder)
        result += "std";
    else if ((flags & QtOrderingType::QtOrder) == QtOrderingType::QtOrder)
        result += "Qt";

    result += "::";
    const bool isStrong = ((flags & QtOrderingType::Strong) == QtOrderingType::Strong);
    if (isStrong)
        result += "strong";
    else if ((flags & QtOrderingType::Weak) == QtOrderingType::Weak)
        result += "weak";
    else if ((flags & QtOrderingType::Partial) == QtOrderingType::Partial)
        result += "partial";
    result += "_ordering::";

    if (order == Qt::partial_ordering::equivalent) {
        if (isStrong)
            result += "equal";
        else
            result += "equivalent";
    } else if (order == Qt::partial_ordering::greater) {
        result += "greater";
    } else if (order == Qt::partial_ordering::less) {
        result += "less";
    } else {
        result += "unordered";
    }
    stream->ts << result.data();
}